

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

const_iterator __thiscall
QHash<QGraphicsItem*,QHashDummyValue>::constFindImpl<QGraphicsItem*>
          (QHash<QGraphicsItem*,QHashDummyValue> *this,QGraphicsItem **key)

{
  Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> *this_00;
  Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = *(Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> **)this;
  if ((this_00 != (Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> *)0x0) &&
     (*(long *)(this_00 + 8) != 0)) {
    uVar2 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>>::
            findBucketWithHash<QGraphicsItem*>
                      (this_00,key,uVar2 >> 0x20 ^ *(ulong *)(this_00 + 0x18) ^ uVar2);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = *(Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> **)this;
      uVar2 = ((ulong)((long)BVar3.span - (long)pDVar1->spans) >> 4) * 0x1c71c71c71c71c80 |
              BVar3.index;
      goto LAB_00617dc1;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *)0x0;
LAB_00617dc1:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }